

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
::Unarchive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
            *this,MemIOReader *Reader)

{
  bool bVar1;
  ui32_t i;
  uint uVar2;
  ui32_t item_count;
  ui32_t item_size;
  value_type tmp_item;
  uint local_50;
  ui32_t local_4c;
  IndexEntry local_48;
  
  bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_50);
  if ((!bVar1) || (bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_4c), !bVar1)) {
    return false;
  }
  uVar2 = 0;
  if ((local_50 != 0) && (local_4c != 0xb)) {
    return false;
  }
  bVar1 = true;
  while( true ) {
    if (bVar1 == false) {
      return false;
    }
    if (local_50 <= uVar2) break;
    local_48.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00216bc8;
    local_48.TemporalOffset = '\0';
    local_48.KeyFrameOffset = '\0';
    local_48.Flags = 0x80;
    local_48.StreamOffset = 0;
    bVar1 = IndexTableSegment::IndexEntry::Unarchive(&local_48,Reader);
    if (bVar1) {
      std::
      vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
      ::push_back(&this->
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                  ,&local_48);
    }
    uVar2 = uVar2 + 1;
  }
  return bVar1;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }